

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

aom_codec_err_t av1_firstpass_info_move_cur_index(FIRSTPASS_INFO *firstpass_info)

{
  bool bVar1;
  FIRSTPASS_INFO *firstpass_info_local;
  aom_codec_err_t local_4;
  
  bVar1 = firstpass_info->future_stats_count < 2;
  if (!bVar1) {
    firstpass_info->cur_index = (firstpass_info->cur_index + 1) % firstpass_info->stats_buf_size;
    firstpass_info->future_stats_count = firstpass_info->future_stats_count + -1;
    firstpass_info->past_stats_count = firstpass_info->past_stats_count + 1;
  }
  local_4 = (aom_codec_err_t)bVar1;
  return local_4;
}

Assistant:

aom_codec_err_t av1_firstpass_info_move_cur_index(
    FIRSTPASS_INFO *firstpass_info) {
  assert(firstpass_info->future_stats_count +
             firstpass_info->past_stats_count ==
         firstpass_info->stats_count);
  if (firstpass_info->future_stats_count > 1) {
    firstpass_info->cur_index =
        (firstpass_info->cur_index + 1) % firstpass_info->stats_buf_size;
    --firstpass_info->future_stats_count;
    ++firstpass_info->past_stats_count;
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_ERROR;
  }
}